

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O3

int64_t pick_interintra_wedge(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1)

{
  byte bVar1;
  byte bVar2;
  int64_t iVar3;
  undefined7 in_register_00000011;
  uint64_t *best_sse;
  uint rows;
  int8_t wedge_index;
  uint64_t sse;
  int16_t diff10 [16384];
  int16_t residual1 [16384];
  undefined1 uStack_1007d;
  undefined4 uStack_1007c;
  uint8_t *puStack_10078;
  long lStack_10070;
  int8_t aiStack_10068 [8];
  int16_t aiStack_10060 [16384];
  int16_t local_8060 [16408];
  
  puStack_10078 = (uint8_t *)CONCAT71(in_register_00000011,bsize);
  lStack_10070 = **(long **)((cpi->enc_quant_dequant_params).quants.y_zbin[4] + 4);
  uStack_1007c = SUB84(x,0);
  bVar1 = block_size_wide[(ulong)x & 0xffffffff];
  best_sse = (uint64_t *)(ulong)bVar1;
  bVar2 = block_size_high[(ulong)x & 0xffffffff];
  rows = (uint)bVar2;
  if ((*(byte *)(*(long *)((cpi->enc_quant_dequant_params).quants.y_zbin[10] + 4) + 0xc0) & 8) == 0)
  {
    (*aom_subtract_block)
              (rows,(uint)bVar1,local_8060,(ptrdiff_t)best_sse,
               *(uint8_t **)(cpi->enc_quant_dequant_params).quants.y_quant[2],
               (long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant[3] + 4),p0,
               (ptrdiff_t)best_sse);
    (*aom_subtract_block)
              ((uint)bVar2,(uint)bVar1,aiStack_10060,(ptrdiff_t)best_sse,p0,(ptrdiff_t)best_sse,
               puStack_10078,(ptrdiff_t)best_sse);
  }
  else {
    aom_highbd_subtract_block_sse2
              (rows,(uint)bVar1,local_8060,(ptrdiff_t)best_sse,
               *(uint8_t **)(cpi->enc_quant_dequant_params).quants.y_quant[2],
               (long)*(int *)((cpi->enc_quant_dequant_params).quants.y_quant[3] + 4),
               (uint8_t *)((ulong)p0 >> 1),(ptrdiff_t)best_sse);
    aom_highbd_subtract_block_sse2
              (rows,(uint)bVar1,aiStack_10060,(ptrdiff_t)best_sse,(uint8_t *)((ulong)p0 >> 1),
               (ptrdiff_t)best_sse,(uint8_t *)((ulong)puStack_10078 >> 1),(ptrdiff_t)best_sse);
  }
  uStack_1007d = 0xff;
  iVar3 = pick_wedge_fixed_sign
                    (cpi,(MACROBLOCK *)(ulong)(byte)uStack_1007c,(BLOCK_SIZE)local_8060,
                     aiStack_10060,(int16_t *)0x0,(int8_t)&uStack_1007d,aiStack_10068,best_sse);
  *(undefined1 *)(lStack_10070 + 0x41) = uStack_1007d;
  return iVar3;
}

Assistant:

static int64_t pick_interintra_wedge(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     const BLOCK_SIZE bsize,
                                     const uint8_t *const p0,
                                     const uint8_t *const p1) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(av1_is_wedge_used(bsize));
  assert(cpi->common.seq_params->enable_interintra_compound);

  const struct buf_2d *const src = &x->plane[0].src;
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  DECLARE_ALIGNED(32, int16_t, residual1[MAX_SB_SQUARE]);  // src - pred1
  DECLARE_ALIGNED(32, int16_t, diff10[MAX_SB_SQUARE]);     // pred1 - pred0
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    aom_highbd_subtract_block(bh, bw, residual1, bw, src->buf, src->stride,
                              CONVERT_TO_BYTEPTR(p1), bw);
    aom_highbd_subtract_block(bh, bw, diff10, bw, CONVERT_TO_BYTEPTR(p1), bw,
                              CONVERT_TO_BYTEPTR(p0), bw);
  } else {
    aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, p1, bw);
    aom_subtract_block(bh, bw, diff10, bw, p1, bw, p0, bw);
  }
#else
  aom_subtract_block(bh, bw, residual1, bw, src->buf, src->stride, p1, bw);
  aom_subtract_block(bh, bw, diff10, bw, p1, bw, p0, bw);
#endif
  int8_t wedge_index = -1;
  uint64_t sse;
  int64_t rd = pick_wedge_fixed_sign(cpi, x, bsize, residual1, diff10, 0,
                                     &wedge_index, &sse);

  mbmi->interintra_wedge_index = wedge_index;
  return rd;
}